

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

void Assimp::MD5::MD5Parser::ReportError(char *error,uint line)

{
  runtime_error *this;
  size_t sVar1;
  char szBuffer [1024];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  char local_428 [1032];
  
  snprintf(local_428,0x400,"[MD5] Line %u: %s",line,error);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_448[0] = local_438;
  sVar1 = strlen(local_428);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,local_428,local_428 + sVar1);
  std::runtime_error::runtime_error(this,(string *)local_448);
  *(undefined ***)this = &PTR__runtime_error_00896c98;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void MD5Parser::ReportError (const char* error, unsigned int line)
{
    char szBuffer[1024];
    ::ai_snprintf(szBuffer, 1024, "[MD5] Line %u: %s",line,error);
    throw DeadlyImportError(szBuffer);
}